

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O0

void __thiscall
Basis::Basis(Basis *this,Runtime *rt,vector<int,_std::allocator<int>_> *active,
            vector<BasisStatus,_std::allocator<BasisStatus>_> *status,
            vector<int,_std::allocator<int>_> *inactive)

{
  mapped_type *pmVar1;
  size_type sVar2;
  reference pvVar3;
  MatrixBase *this_00;
  vector<BasisStatus,_std::allocator<BasisStatus>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  size_t i_2;
  size_t i_1;
  HighsInt i;
  Basis *in_stack_00000720;
  MatrixBase *in_stack_fffffffffffffec8;
  HVectorBase<double> *in_stack_fffffffffffffed0;
  value_type_conflict2 *in_stack_fffffffffffffed8;
  HighsInt size_;
  HVectorBase<double> *in_stack_fffffffffffffee0;
  HighsInt in_stack_fffffffffffffefc;
  value_type vVar4;
  HFactor *in_stack_ffffffffffffff00;
  mapped_type *in_stack_ffffffffffffff08;
  map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
  *in_stack_ffffffffffffff10;
  ulong local_48;
  ulong local_40;
  int local_38;
  
  HVectorBase<double>::HVectorBase(in_stack_fffffffffffffed0);
  QpVector::QpVector((QpVector *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  QpVector::QpVector((QpVector *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  *(undefined8 *)(in_RDI + 0x120) = in_RSI;
  HFactor::HFactor(in_stack_ffffffffffffff00);
  *(undefined4 *)(in_RDI + 0x8a0) = 0;
  MatrixBase::MatrixBase((MatrixBase *)in_stack_fffffffffffffed0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x754d85);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x754da1);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x754dbd);
  std::map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>::
  map((map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_> *)
      0x754dd9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x754df5);
  QpVector::QpVector((QpVector *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  QpVector::QpVector((QpVector *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  *(undefined4 *)(in_RDI + 0x9f8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x9fc) = 0xffffffff;
  HVectorBase<double>::HVectorBase(in_stack_fffffffffffffed0);
  HVectorBase<double>::HVectorBase(in_stack_fffffffffffffed0);
  *(undefined1 *)(in_RDI + 0xb60) = 0;
  HVectorBase<double>::setup
            (in_stack_fffffffffffffee0,(HighsInt)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  for (local_38 = 0;
      local_38 < *(int *)(*(long *)(in_RDI + 0x120) + 4) + *(int *)(*(long *)(in_RDI + 0x120) + 8);
      local_38 = local_38 + 1) {
    pmVar1 = std::
             map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
             ::operator[](in_stack_ffffffffffffff10,(key_type_conflict1 *)in_stack_ffffffffffffff08)
    ;
    *pmVar1 = kInactive;
  }
  local_40 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
    if (sVar2 <= local_40) break;
    in_stack_ffffffffffffff10 =
         (map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
          *)(in_RDI + 0x8f8);
    std::vector<int,_std::allocator<int>_>::operator[](in_RDX,local_40);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
    pvVar3 = std::vector<BasisStatus,_std::allocator<BasisStatus>_>::operator[](in_RCX,local_40);
    vVar4 = *pvVar3;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x8f8),local_40);
    in_stack_ffffffffffffff08 =
         std::
         map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
         ::operator[](in_stack_ffffffffffffff10,(key_type_conflict1 *)in_stack_ffffffffffffff08);
    *in_stack_ffffffffffffff08 = vVar4;
    local_40 = local_40 + 1;
  }
  local_48 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_R8);
    if (sVar2 <= local_48) break;
    std::vector<int,_std::allocator<int>_>::operator[](in_R8,local_48);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
    in_stack_fffffffffffffed8 = (value_type_conflict2 *)(in_RDI + 0x940);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x910),local_48);
    in_stack_fffffffffffffee0 =
         (HVectorBase<double> *)
         std::
         map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
         ::operator[](in_stack_ffffffffffffff10,(key_type_conflict1 *)in_stack_ffffffffffffff08);
    in_stack_fffffffffffffee0->size = 3;
    local_48 = local_48 + 1;
  }
  this_00 = Matrix::t((Matrix *)in_stack_fffffffffffffed0);
  size_ = (HighsInt)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  MatrixBase::operator=(this_00,in_stack_fffffffffffffec8);
  HVectorBase<double>::setup(in_stack_fffffffffffffee0,size_);
  HVectorBase<double>::setup(in_stack_fffffffffffffee0,size_);
  build(in_stack_00000720);
  return;
}

Assistant:

Basis::Basis(Runtime& rt, std::vector<HighsInt> active,
             std::vector<BasisStatus> status, std::vector<HighsInt> inactive)
    : Ztprod_res(rt.instance.num_var),
      buffer_Zprod(rt.instance.num_var),
      runtime(rt),
      buffer_column_aq(rt.instance.num_var),
      buffer_row_ep(rt.instance.num_var) {
  buffer_vec2hvec.setup(rt.instance.num_var);

  for (HighsInt i = 0; i < runtime.instance.num_var + runtime.instance.num_con;
       i++) {
    basisstatus[i] = BasisStatus::kInactive;
  }

  for (size_t i = 0; i < active.size(); i++) {
    active_constraint_index.push_back(active[i]);
    basisstatus[active_constraint_index[i]] = status[i];
  }
  for (size_t i = 0; i < inactive.size(); i++) {
    non_active_constraint_index.push_back(inactive[i]);
    basisstatus[non_active_constraint_index[i]] = BasisStatus::kInactiveInBasis;
  }

  Atran = rt.instance.A.t();

  col_aq.setup(rt.instance.num_var);
  row_ep.setup(rt.instance.num_var);

  build();
}